

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O3

bool __thiscall
BamTools::ResolveTool::StatsFileReader::Read
          (StatsFileReader *this,ResolveSettings *settings,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>_>
          *readGroups)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  string *this_00;
  int iVar5;
  string line;
  string local_70;
  string local_50;
  
  cVar2 = std::__basic_file<char>::is_open();
  if (settings == (ResolveSettings *)0x0 || cVar2 != '\x01') {
    bVar3 = false;
  }
  else {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>_>
    ::clear(&readGroups->_M_t);
    SkipCommentsAndWhitespace_abi_cxx11_(&local_70,this);
    bVar3 = true;
    if (local_70._M_string_length != 0) {
      iVar4 = 0;
      do {
        bVar3 = Utilities::StartsWith(&local_70,&INPUT_TOKEN_abi_cxx11_);
        iVar1 = 1;
        if (!bVar3) {
          bVar3 = Utilities::StartsWith(&local_70,&OPTIONS_TOKEN_abi_cxx11_);
          iVar5 = 2;
          iVar1 = 2;
          if (!bVar3) {
            this_00 = &local_70;
            bVar3 = Utilities::StartsWith(&local_70,&READGROUPS_TOKEN_abi_cxx11_);
            if (bVar3) {
              iVar1 = 3;
            }
            else {
              iVar1 = iVar4;
              if (iVar4 != 1) {
                if (iVar4 == 3) {
                  bVar3 = ParseReadGroupLine((StatsFileReader *)this_00,&local_70,readGroups);
                  iVar5 = 3;
LAB_00168e3f:
                  iVar1 = iVar5;
                  if (bVar3 != false) goto LAB_00168e48;
                }
                else if (iVar4 == 2) {
                  bVar3 = ParseOptionLine((StatsFileReader *)this_00,&local_70,settings);
                  goto LAB_00168e3f;
                }
                bVar3 = false;
                goto LAB_00168e84;
              }
            }
          }
        }
LAB_00168e48:
        iVar4 = iVar1;
        SkipCommentsAndWhitespace_abi_cxx11_(&local_50,this);
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      } while (local_70._M_string_length != 0);
      bVar3 = true;
    }
LAB_00168e84:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return bVar3;
}

Assistant:

bool ResolveTool::StatsFileReader::Read(ResolveTool::ResolveSettings* settings,
                                        std::map<std::string, ReadGroupResolver>& readGroups)
{
    // up-front sanity checks
    if (!m_stream.is_open() || settings == 0) return false;

    // clear out read group data
    readGroups.clear();

    // initialize state
    State currentState = StatsFileReader::None;

    // read stats file
    std::string line = SkipCommentsAndWhitespace();
    while (!line.empty()) {

        bool foundError = false;

        // switch state on keyword found
        if (Utilities::StartsWith(line, INPUT_TOKEN))
            currentState = StatsFileReader::InInput;
        else if (Utilities::StartsWith(line, OPTIONS_TOKEN))
            currentState = StatsFileReader::InOptions;
        else if (Utilities::StartsWith(line, READGROUPS_TOKEN))
            currentState = StatsFileReader::InReadGroups;

        // otherwise parse data line, depending on state
        else {
            if (currentState == StatsFileReader::InInput)
                foundError = !ParseInputLine(line);
            else if (currentState == StatsFileReader::InOptions)
                foundError = !ParseOptionLine(line, settings);
            else if (currentState == StatsFileReader::InReadGroups)
                foundError = !ParseReadGroupLine(line, readGroups);
            else
                foundError = true;
        }

        // break out if error found
        if (foundError) return false;

        // get next line
        line = SkipCommentsAndWhitespace();
    }

    // if here, return success
    return true;
}